

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall CVmObjDict::notify_delete(CVmObjDict *this,int param_1)

{
  CVmHashTable *this_00;
  vmdict_TrieNode *this_01;
  char *pcVar1;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (pcVar1 != (char *)0x0) {
    this_00 = *(CVmHashTable **)(pcVar1 + 0x10);
    if (this_00 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(this_00);
      operator_delete(this_00,0x20);
      pcVar1 = (this->super_CVmObject).ext_;
    }
    this_01 = *(vmdict_TrieNode **)(pcVar1 + 0x38);
    if (this_01 != (vmdict_TrieNode *)0x0) {
      vmdict_TrieNode::~vmdict_TrieNode(this_01);
      operator_delete(this_01,0x18);
      pcVar1 = (this->super_CVmObject).ext_;
    }
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,pcVar1);
    return;
  }
  return;
}

Assistant:

void CVmObjDict::notify_delete(VMG_ int /*in_root_set*/)
{
    /* free our additional data */
    if (ext_ != 0)
    {
        /* free our hash table */
        if (get_ext()->hashtab_ != 0)
            delete get_ext()->hashtab_;

        /* free our Trie */
        if (get_ext()->trie_ != 0)
            delete get_ext()->trie_;

        /* free the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}